

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O3

void pty_pre_init(void)

{
  __uid_t _Var1;
  __uid_t _Var2;
  __gid_t _Var3;
  __gid_t _Var4;
  int iVar5;
  __pid_t _Var6;
  Pty *pty;
  ssize_t sVar7;
  passwd *ppVar8;
  size_t __n;
  int pipefd [2];
  timeval tv;
  char buffer [128];
  char display [128];
  int local_158;
  int local_154;
  char *local_150;
  timeval local_148;
  char local_138 [128];
  char local_b8 [127];
  undefined1 local_39;
  
  pty = (Pty *)safemalloc(1,0x10d0,0);
  memset(pty,0,0x10d0);
  bufchain_init(&pty->output_data);
  single_pty = pty;
  if (pty_setup_sigchld_handler_setup == '\0') {
    putty_signal(0x11,sigchld_handler);
    pty_setup_sigchld_handler_setup = '\x01';
  }
  pty->master_fd = -1;
  pty->slave_fd = -1;
  pty_stamped_utmp = '\0';
  _Var1 = geteuid();
  _Var2 = getuid();
  if (_Var1 == _Var2) {
    _Var3 = getegid();
    _Var4 = getgid();
    if (_Var3 != _Var4) goto LAB_00112ae6;
LAB_00112b28:
    _Var3 = getgid();
    _Var1 = getuid();
    pty = (Pty *)(ulong)_Var1;
    iVar5 = setresgid(_Var3,_Var3,_Var3);
    if (iVar5 < 0) {
      pty_pre_init_cold_4();
    }
    else {
      iVar5 = setresuid(_Var1,_Var1,_Var1);
      if (-1 < iVar5) {
        return;
      }
    }
    pty_pre_init_cold_3();
LAB_00112b70:
    pty_pre_init_cold_2();
  }
  else {
LAB_00112ae6:
    pty_open_master(pty);
    iVar5 = pipe(&local_158);
    if (iVar5 < 0) goto LAB_00112b70;
    cloexec(local_158);
    cloexec(local_154);
    _Var6 = fork();
    if (-1 < _Var6) {
      if (_Var6 == 0) goto LAB_00112b7a;
      close(local_158);
      pty_utmp_helper_pipe = local_154;
      goto LAB_00112b28;
    }
  }
  pty_pre_init_cold_1();
LAB_00112b7a:
  close(local_154);
  sVar7 = read(local_158,local_138,0x80);
  if (0 < (int)sVar7) {
    local_150 = pty->name + 5;
    do {
      if (pty_stamped_utmp == '\0') {
        __n = (size_t)((uint)sVar7 & 0x7fffffff);
        if (0x7f < __n) {
          __n = 0x80;
        }
        memcpy(local_b8,local_138,__n);
        if (local_138[(uint)sVar7 - 1] == '\0') {
          local_39 = 0;
          putty_signal(1,fatal_sig_handler);
          putty_signal(2,fatal_sig_handler);
          putty_signal(3,fatal_sig_handler);
          putty_signal(4,fatal_sig_handler);
          putty_signal(6,fatal_sig_handler);
          putty_signal(8,fatal_sig_handler);
          putty_signal(0xd,fatal_sig_handler);
          putty_signal(0xe,fatal_sig_handler);
          putty_signal(0xf,fatal_sig_handler);
          putty_signal(0xb,fatal_sig_handler);
          putty_signal(10,fatal_sig_handler);
          putty_signal(0xc,fatal_sig_handler);
          putty_signal(7,fatal_sig_handler);
          putty_signal(0x1d,fatal_sig_handler);
          putty_signal(0x1b,fatal_sig_handler);
          putty_signal(0x1f,fatal_sig_handler);
          putty_signal(5,fatal_sig_handler);
          putty_signal(0x1a,fatal_sig_handler);
          putty_signal(0x18,fatal_sig_handler);
          putty_signal(0x19,fatal_sig_handler);
          putty_signal(0x1d,fatal_sig_handler);
          _Var1 = getuid();
          ppVar8 = getpwuid(_Var1);
          if (ppVar8 != (passwd *)0x0) {
            memset(&utmp_entry,0,0x180);
            utmp_entry.ut_type = 7;
            utmp_entry.ut_pid = getpid();
            strncpy(utmp_entry.ut_line,local_150,0x20);
            strncpy(utmp_entry.ut_id,pty->name + 8,4);
            strncpy(utmp_entry.ut_user,ppVar8->pw_name,0x20);
            strncpy(utmp_entry.ut_host,local_b8,0x100);
            gettimeofday(&local_148,(__timezone_ptr_t)0x0);
            utmp_entry.ut_tv.tv_usec = (__int32_t)local_148.tv_usec;
            utmp_entry.ut_tv.tv_sec = (__int32_t)local_148.tv_sec;
            setutxent();
            pututxline((utmpx *)&utmp_entry);
            endutxent();
            updwtmpx("/var/log/wtmp",(utmpx *)&utmp_entry);
            pty_stamped_utmp = '\x01';
          }
        }
      }
      sVar7 = read(local_158,local_138,0x80);
    } while (0 < (int)sVar7);
  }
  cleanup_utmp();
  _exit(0);
}

Assistant:

void pty_pre_init(void)
{
#ifndef NO_PTY_PRE_INIT

    Pty *pty;

#ifndef OMIT_UTMP
    pid_t pid;
    int pipefd[2];
#endif

    pty = single_pty = new_pty_struct();

    /* set the child signal handler straight away; it needs to be set
     * before we ever fork. */
    pty_setup_sigchld_handler();
    pty->master_fd = pty->slave_fd = -1;
#ifndef OMIT_UTMP
    pty_stamped_utmp = false;
#endif

    if (geteuid() != getuid() || getegid() != getgid()) {
        pty_open_master(pty);

#ifndef OMIT_UTMP
        /*
         * Fork off the utmp helper.
         */
        if (pipe(pipefd) < 0) {
            perror("pterm: pipe");
            exit(1);
        }
        cloexec(pipefd[0]);
        cloexec(pipefd[1]);
        pid = fork();
        if (pid < 0) {
            perror("pterm: fork");
            exit(1);
        } else if (pid == 0) {
            char display[128], buffer[128];
            int dlen, ret;

            close(pipefd[1]);
            /*
             * Now sit here until we receive a display name from the
             * other end of the pipe, and then stamp utmp. Unstamp utmp
             * again, and exit, when the pipe closes.
             */

            dlen = 0;
            while (1) {

                ret = read(pipefd[0], buffer, lenof(buffer));
                if (ret <= 0) {
                    cleanup_utmp();
                    _exit(0);
                } else if (!pty_stamped_utmp) {
                    if (dlen < lenof(display))
                        memcpy(display+dlen, buffer,
                               min(ret, lenof(display)-dlen));
                    if (buffer[ret-1] == '\0') {
                        /*
                         * Now we have a display name. NUL-terminate
                         * it, and stamp utmp.
                         */
                        display[lenof(display)-1] = '\0';
                        /*
                         * Trap as many fatal signals as we can in the
                         * hope of having the best possible chance to
                         * clean up utmp before termination. We are
                         * unfortunately unprotected against SIGKILL,
                         * but that's life.
                         */
                        putty_signal(SIGHUP, fatal_sig_handler);
                        putty_signal(SIGINT, fatal_sig_handler);
                        putty_signal(SIGQUIT, fatal_sig_handler);
                        putty_signal(SIGILL, fatal_sig_handler);
                        putty_signal(SIGABRT, fatal_sig_handler);
                        putty_signal(SIGFPE, fatal_sig_handler);
                        putty_signal(SIGPIPE, fatal_sig_handler);
                        putty_signal(SIGALRM, fatal_sig_handler);
                        putty_signal(SIGTERM, fatal_sig_handler);
                        putty_signal(SIGSEGV, fatal_sig_handler);
                        putty_signal(SIGUSR1, fatal_sig_handler);
                        putty_signal(SIGUSR2, fatal_sig_handler);
#ifdef SIGBUS
                        putty_signal(SIGBUS, fatal_sig_handler);
#endif
#ifdef SIGPOLL
                        putty_signal(SIGPOLL, fatal_sig_handler);
#endif
#ifdef SIGPROF
                        putty_signal(SIGPROF, fatal_sig_handler);
#endif
#ifdef SIGSYS
                        putty_signal(SIGSYS, fatal_sig_handler);
#endif
#ifdef SIGTRAP
                        putty_signal(SIGTRAP, fatal_sig_handler);
#endif
#ifdef SIGVTALRM
                        putty_signal(SIGVTALRM, fatal_sig_handler);
#endif
#ifdef SIGXCPU
                        putty_signal(SIGXCPU, fatal_sig_handler);
#endif
#ifdef SIGXFSZ
                        putty_signal(SIGXFSZ, fatal_sig_handler);
#endif
#ifdef SIGIO
                        putty_signal(SIGIO, fatal_sig_handler);
#endif
                        setup_utmp(pty->name, display);
                    }
                }
            }
        } else {
            close(pipefd[0]);
            pty_utmp_helper_pid = pid;
            pty_utmp_helper_pipe = pipefd[1];
        }
#endif
    }

    /* Drop privs. */
    {
#if HAVE_SETRESUID && HAVE_SETRESGID
        int gid = getgid(), uid = getuid();
        int setresgid(gid_t, gid_t, gid_t);
        int setresuid(uid_t, uid_t, uid_t);
        if (setresgid(gid, gid, gid) < 0) {
            perror("setresgid");
            exit(1);
        }
        if (setresuid(uid, uid, uid) < 0) {
            perror("setresuid");
            exit(1);
        }
#else
        if (setgid(getgid()) < 0) {
            perror("setgid");
            exit(1);
        }
        if (setuid(getuid()) < 0) {
            perror("setuid");
            exit(1);
        }
#endif
    }

#endif /* NO_PTY_PRE_INIT */

}